

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

void __thiscall bloaty::NameMunger::AddRegex(NameMunger *this,string *regex,string *replacement)

{
  RE2 *this_00;
  __single_object reg;
  _Head_base<0UL,_bloaty::ReImpl_*,_false> local_50;
  pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  this_00 = (RE2 *)operator_new(0xd8);
  re2::RE2::RE2(this_00,regex);
  local_50._M_head_impl = (ReImpl *)this_00;
  std::
  pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_true>
            (&local_48,(unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_> *)&local_50
             ,replacement);
  std::
  vector<std::pair<std::unique_ptr<bloaty::ReImpl,std::default_delete<bloaty::ReImpl>>,std::__cxx11::string>,std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,std::default_delete<bloaty::ReImpl>>,std::__cxx11::string>>>
  ::
  emplace_back<std::pair<std::unique_ptr<bloaty::ReImpl,std::default_delete<bloaty::ReImpl>>,std::__cxx11::string>>
            ((vector<std::pair<std::unique_ptr<bloaty::ReImpl,std::default_delete<bloaty::ReImpl>>,std::__cxx11::string>,std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,std::default_delete<bloaty::ReImpl>>,std::__cxx11::string>>>
              *)this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.second._M_dataplus._M_p != &local_48.second.field_2) {
    operator_delete(local_48.second._M_dataplus._M_p,
                    local_48.second.field_2._M_allocated_capacity + 1);
  }
  std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>::~unique_ptr
            (&local_48.first);
  std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>::~unique_ptr
            ((unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_> *)&local_50);
  return;
}

Assistant:

void NameMunger::AddRegex(const std::string& regex,
                          const std::string& replacement) {
  auto reg = absl::make_unique<ReImpl>(regex);
  regexes_.push_back(std::make_pair(std::move(reg), replacement));
}